

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::UninterpretedOption_NamePart::_InternalParse
          (UninterpretedOption_NamePart *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint32 res;
  uint tag;
  byte *p;
  uint uVar5;
  Arena *arena;
  string *s;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  pair<const_char_*,_bool> pVar8;
  
  this_00 = &this->name_part_;
  uVar5 = 0;
LAB_00174ba1:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00174cfa;
      pVar8 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar8.first;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00174cfa;
    }
    bVar1 = *ptr;
    pVar6.second._0_1_ = bVar1;
    pVar6.first = (char *)((byte *)ptr + 1);
    pVar6._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar6 = internal::ReadTagFallback(ptr,res);
        if (pVar6.first == (char *)0x0) goto LAB_00174d10;
      }
      else {
        pVar6.second = res;
        pVar6.first = (char *)((byte *)ptr + 2);
        pVar6._12_4_ = 0;
      }
    }
    p = (byte *)pVar6.first;
    tag = pVar6.second;
    uVar3 = (uint)(pVar6._8_8_ >> 3) & 0x1fffffff;
    if (uVar3 == 2) {
      if ((char)pVar6.second == '\x10') {
        uVar4 = (ulong)(char)*p;
        ptr = (char *)(p + 1);
        if ((long)uVar4 < 0) {
          uVar5 = ((uint)*p + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar7 = internal::VarintParseSlow64((char *)p,uVar5);
            ptr = pVar7.first;
            this->is_extension_ = pVar7.second != 0;
            uVar5 = 2;
            goto LAB_00174c9d;
          }
          uVar4 = (ulong)uVar5;
          ptr = (char *)(p + 2);
        }
        this->is_extension_ = uVar4 != 0;
        uVar5 = 2;
        goto LAB_00174ba1;
      }
LAB_00174c7f:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        ptr = (char *)p;
        goto LAB_00174cfa;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,(char *)p,ctx);
    }
    else {
      if ((uVar3 != 1) || ((char)pVar6.second != '\n')) goto LAB_00174c7f;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      arena = (Arena *)(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      s = this_00->ptr_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_00->ptr_;
      }
      ptr = internal::InlineGreedyStringParser(s,(char *)p,ctx);
    }
LAB_00174c9d:
    if ((byte *)ptr == (byte *)0x0) {
LAB_00174d10:
      ptr = (char *)(byte *)0x0;
LAB_00174cfa:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar5;
      return (char *)(byte *)ptr;
    }
  } while( true );
}

Assistant:

const char* UninterpretedOption_NamePart::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string name_part = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name_part(), ptr, ctx, "google.protobuf.UninterpretedOption.NamePart.name_part");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // required bool is_extension = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_is_extension(&has_bits);
          is_extension_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}